

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  undefined1 *puVar1;
  curl_off_t *pcVar2;
  long lVar3;
  Curl_easy *pCVar4;
  uint uVar5;
  curl_off_t *pcVar6;
  _Bool _Var7;
  byte bVar8;
  anon_enum_32 aVar9;
  CURLcode CVar10;
  CURLcode CVar11;
  int iVar12;
  CHUNKcode CVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  timediff_t tVar17;
  size_t size;
  ulong uVar18;
  char *pcVar19;
  char *pcVar20;
  char *pcVar21;
  http_connect_state *s;
  curl_socket_t sockfd;
  bool bVar22;
  char byte;
  Curl_easy *local_b8;
  curl_socket_t local_b0;
  int local_ac;
  int *local_a8;
  uint local_9c;
  curl_off_t *local_98;
  int subversion;
  long local_88;
  connectdata *local_80;
  char *local_78;
  ssize_t tookcareof;
  char *local_68;
  curl_off_t *local_60;
  dynbuf req;
  CURLcode extra;
  
  s = conn->connect_state;
  if (s == (http_connect_state *)0x0) {
    CVar10 = connect_init(conn,false);
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
    s = conn->connect_state;
  }
  subversion = 0;
  local_9c = remote_port;
  local_78 = hostname;
  if ((s != (http_connect_state *)0x0) && (s->tunnel_state != TUNNEL_COMPLETE)) {
    local_b8 = conn->data;
    local_88 = (long)sockindex;
    sockfd = conn->sock[local_88];
    puVar1 = &(conn->bits).field_0x4;
    *puVar1 = *puVar1 & 0xef;
    local_60 = &(local_b8->info).request_size;
    local_a8 = &(local_b8->req).httpcode;
    local_98 = &s->cl;
    local_b0 = sockfd;
    local_ac = sockindex;
    do {
      aVar9 = s->tunnel_state;
      do {
        pcVar14 = local_78;
        uVar5 = local_9c;
        pCVar4 = local_b8;
        if (aVar9 == TUNNEL_INIT) {
          local_80 = conn;
          Curl_infof(local_b8,"Establish HTTP proxy tunnel to %s:%d\n",local_78,(ulong)local_9c);
          (*Curl_cfree)((pCVar4->req).newurl);
          (pCVar4->req).newurl = (char *)0x0;
          pcVar14 = curl_maprintf("%s:%d",pcVar14,(ulong)uVar5);
          if (pcVar14 == (char *)0x0) {
            conn = local_80;
            CVar10 = CURLE_OUT_OF_MEMORY;
            goto LAB_0012767f;
          }
          Curl_dyn_init(&req,0x20000);
          conn = local_80;
          CVar10 = Curl_http_output_auth(local_80,"CONNECT",pcVar14,true);
          (*Curl_cfree)(pcVar14);
          pcVar14 = local_78;
          sockfd = local_b0;
          if (CVar10 == CURLE_OK) {
            pcVar20 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar20 = "1.0";
            }
            if ((conn->host).name == local_78) {
              bVar22 = (bool)(((conn->bits).field_0x5 & 0x10) >> 4);
            }
            else {
              pcVar15 = strchr(local_78,0x3a);
              bVar22 = pcVar15 != (char *)0x0;
            }
            pcVar15 = "";
            if (bVar22 != false) {
              pcVar15 = "[";
            }
            pcVar19 = "";
            if (bVar22 != false) {
              pcVar19 = "]";
            }
            pcVar14 = curl_maprintf("%s%s%s:%d",pcVar15,pcVar14,pcVar19,(ulong)local_9c);
            if (pcVar14 == (char *)0x0) {
LAB_00127827:
              Curl_dyn_free(&req);
              CVar10 = CURLE_OUT_OF_MEMORY;
              goto LAB_0012767f;
            }
            local_68 = pcVar20;
            pcVar20 = Curl_checkProxyheaders(conn,"Host");
            if (pcVar20 == (char *)0x0) {
              pcVar20 = curl_maprintf("Host: %s\r\n",pcVar14);
              if (pcVar20 == (char *)0x0) {
                (*Curl_cfree)(pcVar14);
                goto LAB_00127827;
              }
            }
            else {
              pcVar20 = (char *)0x0;
            }
            pcVar15 = Curl_checkProxyheaders(conn,"Proxy-Connection");
            pcVar19 = "";
            if (pcVar15 == (char *)0x0) {
              pcVar19 = "Proxy-Connection: Keep-Alive\r\n";
            }
            pcVar16 = Curl_checkProxyheaders(conn,"User-Agent");
            pcVar15 = "";
            if ((pcVar16 == (char *)0x0) && (pcVar15 = "", (local_b8->set).str[0x26] != (char *)0x0)
               ) {
              pcVar15 = (local_b8->state).aptr.uagent;
            }
            pcVar16 = pcVar20;
            if (pcVar20 == (char *)0x0) {
              pcVar16 = "";
            }
            pcVar21 = (local_b8->state).aptr.proxyuserpwd;
            if (pcVar21 == (char *)0x0) {
              pcVar21 = "";
            }
            CVar11 = Curl_dyn_addf(&req,"CONNECT %s HTTP/%s\r\n%s%s%s%s",pcVar14,local_68,pcVar16,
                                   pcVar21,pcVar15,pcVar19);
            if (pcVar20 != (char *)0x0) {
              (*Curl_cfree)(pcVar20);
            }
            (*Curl_cfree)(pcVar14);
            sockfd = local_b0;
            if (CVar11 == CURLE_OK) {
              CVar11 = Curl_add_custom_headers(conn,true,&req);
              sockfd = local_b0;
              if ((CVar11 == CURLE_OK) && (CVar11 = Curl_dyn_add(&req,"\r\n"), CVar11 == CURLE_OK))
              {
                CVar10 = CURLE_OK;
                CVar11 = Curl_buffer_send(&req,conn,local_60,0,local_ac);
                if (CVar11 == CURLE_OK) goto LAB_00127089;
              }
            }
            CVar10 = CVar11;
            Curl_failf(local_b8,"Failed sending CONNECT to proxy");
          }
LAB_00127089:
          Curl_dyn_free(&req);
          if (CVar10 != CURLE_OK) goto LAB_0012767f;
          s->tunnel_state = TUNNEL_CONNECT;
          sockindex = local_ac;
        }
        tVar17 = Curl_timeleft(local_b8,(curltime *)0x0,true);
        if (tVar17 < 1) {
          Curl_failf(local_b8,"Proxy CONNECT aborted due to timeout");
          CVar10 = CURLE_OPERATION_TIMEDOUT;
          goto LAB_0012767f;
        }
        _Var7 = Curl_conn_data_pending(conn,sockindex);
        if (!_Var7) goto LAB_00126d5d;
LAB_001270d2:
        do {
          while( true ) {
            if (s->keepon == 0) goto LAB_001275a5;
            CVar10 = Curl_read(conn,sockfd,&byte,1,(ssize_t *)&req);
            if (CVar10 == CURLE_AGAIN) goto LAB_00126d5d;
            iVar12 = Curl_pgrsUpdate(conn);
            if (iVar12 != 0) {
              CVar10 = CURLE_ABORTED_BY_CALLBACK;
              goto LAB_0012767f;
            }
            if (CVar10 != CURLE_OK) {
              s->keepon = 0;
              goto LAB_001275a5;
            }
            if ((long)req.bufr < 1) {
              if (((local_b8->set).proxyauth == 0) || ((local_b8->state).authproxy.avail == 0)) {
                Curl_failf(local_b8,"Proxy CONNECT aborted");
                bVar22 = true;
              }
              else {
                puVar1 = &(conn->bits).field_0x4;
                *puVar1 = *puVar1 | 0x10;
                bVar22 = false;
                Curl_infof(local_b8,"Proxy CONNECT connection closed\n");
              }
              s->keepon = 0;
              goto LAB_001275a7;
            }
            if (1 < s->keepon) break;
            CVar10 = Curl_dyn_addn(&s->rcvbuf,&byte,1);
            pCVar4 = local_b8;
            if (CVar10 != CURLE_OK) {
              Curl_failf(local_b8,"CONNECT response too large!");
              goto LAB_00127664;
            }
            if (byte == '\n') {
              pcVar14 = Curl_dyn_ptr(&s->rcvbuf);
              size = Curl_dyn_len(&s->rcvbuf);
              uVar18 = *(ulong *)&(pCVar4->set).field_0x978;
              if (((uint)uVar18 >> 0x1e & 1) != 0) {
                Curl_debug(pCVar4,CURLINFO_HEADER_IN,pcVar14,size);
                uVar18 = *(ulong *)&(pCVar4->set).field_0x978;
              }
              if (((uVar18 >> 0x31 & 1) == 0) &&
                 (CVar10 = Curl_client_write(conn,(((uint)uVar18 >> 0x19 & 1) != 0) + 2,pcVar14,size
                                            ), CVar10 != CURLE_OK)) goto LAB_0012767f;
              pcVar6 = local_98;
              sockindex = local_ac;
              sockfd = local_b0;
              pcVar2 = &(pCVar4->info).header_size;
              *pcVar2 = *pcVar2 + size;
              if ((*pcVar14 == '\r') || (*pcVar14 == '\n')) {
                if ((*local_a8 == 0x197) && (((pCVar4->state).field_0x600 & 0x20) == 0)) {
                  s->keepon = 2;
                  if (s->cl == 0) {
                    if ((s->field_0x34 & 1) == 0) {
                      s->keepon = 0;
                    }
                    else {
                      Curl_infof(local_b8,"Ignore chunked response-body\n");
                      puVar1 = &(local_b8->req).field_0x560;
                      *puVar1 = *puVar1 | 8;
                      pcVar20 = pcVar14 + 1;
                      if (pcVar14[1] != '\n') {
                        pcVar20 = pcVar14;
                      }
                      CVar13 = Curl_httpchunk_read(conn,pcVar20 + 1,1,(ssize_t *)&req,
                                                   (CURLcode *)&tookcareof);
                      if (CVar13 == CHUNKE_STOP) {
                        Curl_infof(local_b8,"chunk reading DONE\n");
                        s->keepon = 0;
                        s->tunnel_state = TUNNEL_COMPLETE;
                      }
                    }
                  }
                  else {
                    Curl_infof(local_b8,"Ignore %ld bytes of response-body\n");
                  }
                }
                else {
                  s->keepon = 0;
                }
                if (*pcVar6 == 0) goto LAB_001272aa;
              }
              else {
                iVar12 = curl_strnequal("WWW-Authenticate:",pcVar14,0x11);
                sockindex = local_ac;
                if ((iVar12 == 0) || (*local_a8 != 0x191)) {
                  iVar12 = curl_strnequal("Proxy-authenticate:",pcVar14,0x13);
                  if ((iVar12 != 0) && (_Var7 = true, *local_a8 == 0x197)) goto LAB_00127309;
                  iVar12 = curl_strnequal("Content-Length:",pcVar14,0xf);
                  if (iVar12 == 0) {
                    _Var7 = Curl_compareheader(pcVar14,"Connection:","close");
                    if (_Var7) {
                      s->field_0x34 = s->field_0x34 | 2;
                      sockfd = local_b0;
                    }
                    else {
                      iVar12 = curl_strnequal("Transfer-Encoding:",pcVar14,0x12);
                      sockfd = local_b0;
                      if (iVar12 == 0) {
                        _Var7 = Curl_compareheader(pcVar14,"Proxy-Connection:","close");
                        if (_Var7) {
                          s->field_0x34 = s->field_0x34 | 2;
                        }
                        else {
                          iVar12 = __isoc99_sscanf(pcVar14,"HTTP/1.%d %d",&subversion,local_a8);
                          if (iVar12 == 2) {
                            (local_b8->info).httpproxycode = (local_b8->req).httpcode;
                          }
                        }
                      }
                      else if (*local_a8 - 200U < 100) {
                        Curl_infof(local_b8,"Ignoring Transfer-Encoding in CONNECT %03d response\n")
                        ;
                      }
                      else {
                        _Var7 = Curl_compareheader(pcVar14,"Transfer-Encoding:","chunked");
                        if (_Var7) {
                          Curl_infof(local_b8,"CONNECT responded chunked\n");
                          s->field_0x34 = s->field_0x34 | 1;
                          Curl_httpchunk_init(conn);
                        }
                      }
                    }
                  }
                  else if (*local_a8 - 200U < 100) {
                    Curl_infof(pCVar4,"Ignoring Content-Length in CONNECT %03d response\n");
                    sockfd = local_b0;
                  }
                  else {
                    curlx_strtoofft(pcVar14 + 0xf,(char **)0x0,10,local_98);
                    sockfd = local_b0;
                  }
                }
                else {
                  _Var7 = false;
LAB_00127309:
                  pcVar14 = Curl_copy_header_value(pcVar14);
                  if (pcVar14 == (char *)0x0) {
                    CVar10 = CURLE_OUT_OF_MEMORY;
                    goto LAB_0012767f;
                  }
                  CVar10 = Curl_http_input_auth(conn,_Var7,pcVar14);
                  (*Curl_cfree)(pcVar14);
                  sockindex = local_ac;
                  sockfd = local_b0;
                  if (CVar10 != CURLE_OK) goto LAB_0012767f;
                }
                Curl_dyn_reset(&s->rcvbuf);
              }
            }
          }
          lVar3 = *local_98;
          if (lVar3 == 0) {
            tookcareof = 0;
            CVar13 = Curl_httpchunk_read(conn,&byte,1,&tookcareof,&extra);
            if (CVar13 == CHUNKE_STOP) {
              Curl_infof(local_b8,"chunk reading DONE\n");
              s->keepon = 0;
LAB_001272aa:
              s->tunnel_state = TUNNEL_COMPLETE;
            }
            goto LAB_001270d2;
          }
          *local_98 = lVar3 + -1;
        } while (1 < lVar3);
        s->keepon = 0;
        s->tunnel_state = TUNNEL_COMPLETE;
LAB_001275a5:
        bVar22 = false;
LAB_001275a7:
        iVar12 = Curl_pgrsUpdate(conn);
        if ((bVar22) || (iVar12 != 0)) {
          CVar10 = CURLE_RECV_ERROR;
          if (iVar12 != 0) {
            CVar10 = CURLE_ABORTED_BY_CALLBACK;
          }
          goto LAB_0012767f;
        }
        if ((local_b8->info).httpproxycode - 200U < 100) {
          bVar8 = s->field_0x34;
        }
        else {
          CVar10 = Curl_http_auth_act(conn);
          if (CVar10 != CURLE_OK) goto LAB_0012767f;
          bVar8 = s->field_0x34;
          if (((conn->bits).field_0x4 & 0x20) != 0) {
            bVar8 = bVar8 | 2;
            s->field_0x34 = bVar8;
          }
        }
        lVar3 = local_88;
        pcVar14 = (local_b8->req).newurl;
        if ((bVar8 & 2) != 0) {
          if (pcVar14 != (char *)0x0) {
            Curl_closesocket(conn,conn->sock[local_88]);
            conn->sock[lVar3] = -1;
          }
          goto LAB_001276d3;
        }
        if (pcVar14 == (char *)0x0) goto LAB_001276d3;
        aVar9 = s->tunnel_state;
      } while (aVar9 != TUNNEL_COMPLETE);
      connect_init(conn,true);
    } while ((local_b8->req).newurl != (char *)0x0);
LAB_001276d3:
    pCVar4 = local_b8;
    if ((local_b8->info).httpproxycode - 200U < 100) {
      s->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((local_b8->state).aptr.proxyuserpwd);
      (pCVar4->state).aptr.proxyuserpwd = (char *)0x0;
      (pCVar4->state).authproxy.field_0x18 = ((pCVar4->state).authproxy.field_0x18 & 0xfc) + 1;
      Curl_infof(pCVar4,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(pCVar4->info).httpproxycode);
      puVar1 = &(pCVar4->req).field_0x560;
      *puVar1 = *puVar1 & 0xf7;
      puVar1 = &(conn->bits).field_0x6;
      *puVar1 = *puVar1 & 0xfb;
      Curl_dyn_free(&s->rcvbuf);
    }
    else {
      pcVar14 = (local_b8->req).newurl;
      if (pcVar14 == (char *)0x0 || (s->field_0x34 & 2) == 0) {
        (*Curl_cfree)(pcVar14);
        (pCVar4->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar3 = local_88;
        Curl_closesocket(conn,conn->sock[local_88]);
        conn->sock[lVar3] = -1;
      }
      else {
        puVar1 = &(conn->bits).field_0x4;
        *puVar1 = *puVar1 | 0x10;
        Curl_infof(local_b8,"Connect me again please\n");
        connect_done(conn);
      }
      s->tunnel_state = TUNNEL_INIT;
      if (((conn->bits).field_0x4 & 0x10) == 0) {
        Curl_dyn_free(&s->rcvbuf);
        Curl_failf(local_b8,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(local_b8->req).httpcode);
LAB_00127664:
        CVar10 = CURLE_RECV_ERROR;
        goto LAB_0012767f;
      }
    }
  }
LAB_00126d5d:
  CVar10 = CURLE_OK;
  if ((conn->connect_state != (http_connect_state *)0x0) &&
     (conn->connect_state->tunnel_state != TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_0012767f:
  connect_done(conn);
  return CVar10;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}